

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region_grow.cpp
# Opt level: O0

int rg::get_important_obstacles
              (RGProblem *problem,RGRegion *region,
              vector<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>_>
              *obstacles)

{
  RGRegion *this;
  bool bVar1;
  pointer pRVar2;
  CoeffReturnType piVar3;
  Matrix<int,_3,_1,_0,_3,_1> local_60;
  Matrix<int,_3,_1,_0,_3,_1> local_54;
  __normal_iterator<const_rg::RGPoint_*,_std::vector<rg::RGPoint,_std::allocator<rg::RGPoint>_>_>
  local_48;
  __normal_iterator<const_rg::RGPoint_*,_std::vector<rg::RGPoint,_std::allocator<rg::RGPoint>_>_>
  local_40;
  const_iterator it;
  int min_z;
  int max_z;
  int min_y;
  int max_y;
  int min_x;
  int max_x;
  vector<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>_>
  *obstacles_local;
  RGRegion *region_local;
  RGProblem *problem_local;
  
  max_y = -10000;
  min_y = 10000;
  max_z = -10000;
  min_z = 10000;
  it._M_current._4_4_ = -10000;
  it._M_current._0_4_ = 10000;
  _min_x = obstacles;
  obstacles_local =
       (vector<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>_>
        *)region;
  region_local = (RGRegion *)problem;
  local_40._M_current =
       (RGPoint *)
       std::vector<rg::RGPoint,_std::allocator<rg::RGPoint>_>::cbegin(&region->region_bound_pts);
  while( true ) {
    local_48._M_current =
         (RGPoint *)
         std::vector<rg::RGPoint,_std::allocator<rg::RGPoint>_>::cend
                   ((vector<rg::RGPoint,_std::allocator<rg::RGPoint>_> *)obstacles_local);
    bVar1 = __gnu_cxx::operator!=(&local_40,&local_48);
    this = region_local;
    if (!bVar1) break;
    pRVar2 = __gnu_cxx::
             __normal_iterator<const_rg::RGPoint_*,_std::vector<rg::RGPoint,_std::allocator<rg::RGPoint>_>_>
             ::operator->(&local_40);
    piVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_0>::x
                       ((DenseCoeffsBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_0> *)pRVar2);
    if (max_y < *piVar3) {
      pRVar2 = __gnu_cxx::
               __normal_iterator<const_rg::RGPoint_*,_std::vector<rg::RGPoint,_std::allocator<rg::RGPoint>_>_>
               ::operator->(&local_40);
      piVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_0>::x
                         ((DenseCoeffsBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_0> *)pRVar2);
      max_y = *piVar3;
    }
    pRVar2 = __gnu_cxx::
             __normal_iterator<const_rg::RGPoint_*,_std::vector<rg::RGPoint,_std::allocator<rg::RGPoint>_>_>
             ::operator->(&local_40);
    piVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_0>::x
                       ((DenseCoeffsBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_0> *)pRVar2);
    if (*piVar3 < min_y) {
      pRVar2 = __gnu_cxx::
               __normal_iterator<const_rg::RGPoint_*,_std::vector<rg::RGPoint,_std::allocator<rg::RGPoint>_>_>
               ::operator->(&local_40);
      piVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_0>::x
                         ((DenseCoeffsBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_0> *)pRVar2);
      min_y = *piVar3;
    }
    pRVar2 = __gnu_cxx::
             __normal_iterator<const_rg::RGPoint_*,_std::vector<rg::RGPoint,_std::allocator<rg::RGPoint>_>_>
             ::operator->(&local_40);
    piVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_0>::y
                       ((DenseCoeffsBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_0> *)pRVar2);
    if (max_z < *piVar3) {
      pRVar2 = __gnu_cxx::
               __normal_iterator<const_rg::RGPoint_*,_std::vector<rg::RGPoint,_std::allocator<rg::RGPoint>_>_>
               ::operator->(&local_40);
      piVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_0>::y
                         ((DenseCoeffsBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_0> *)pRVar2);
      max_z = *piVar3;
    }
    pRVar2 = __gnu_cxx::
             __normal_iterator<const_rg::RGPoint_*,_std::vector<rg::RGPoint,_std::allocator<rg::RGPoint>_>_>
             ::operator->(&local_40);
    piVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_0>::y
                       ((DenseCoeffsBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_0> *)pRVar2);
    if (*piVar3 < min_z) {
      pRVar2 = __gnu_cxx::
               __normal_iterator<const_rg::RGPoint_*,_std::vector<rg::RGPoint,_std::allocator<rg::RGPoint>_>_>
               ::operator->(&local_40);
      piVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_0>::y
                         ((DenseCoeffsBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_0> *)pRVar2);
      min_z = *piVar3;
    }
    pRVar2 = __gnu_cxx::
             __normal_iterator<const_rg::RGPoint_*,_std::vector<rg::RGPoint,_std::allocator<rg::RGPoint>_>_>
             ::operator->(&local_40);
    piVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_0>::z
                       ((DenseCoeffsBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_0> *)pRVar2);
    if (it._M_current._4_4_ < *piVar3) {
      pRVar2 = __gnu_cxx::
               __normal_iterator<const_rg::RGPoint_*,_std::vector<rg::RGPoint,_std::allocator<rg::RGPoint>_>_>
               ::operator->(&local_40);
      piVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_0>::z
                         ((DenseCoeffsBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_0> *)pRVar2);
      it._M_current._4_4_ = *piVar3;
    }
    pRVar2 = __gnu_cxx::
             __normal_iterator<const_rg::RGPoint_*,_std::vector<rg::RGPoint,_std::allocator<rg::RGPoint>_>_>
             ::operator->(&local_40);
    piVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_0>::z
                       ((DenseCoeffsBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_0> *)pRVar2);
    if (*piVar3 < (int)it._M_current) {
      pRVar2 = __gnu_cxx::
               __normal_iterator<const_rg::RGPoint_*,_std::vector<rg::RGPoint,_std::allocator<rg::RGPoint>_>_>
               ::operator->(&local_40);
      piVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_0>::z
                         ((DenseCoeffsBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_0> *)pRVar2);
      it._M_current._0_4_ = *piVar3;
    }
    __gnu_cxx::
    __normal_iterator<const_rg::RGPoint_*,_std::vector<rg::RGPoint,_std::allocator<rg::RGPoint>_>_>
    ::operator++(&local_40);
  }
  Eigen::Matrix<int,_3,_1,_0,_3,_1>::Matrix
            (&local_54,&max_y,&max_z,(Scalar *)((long)&it._M_current + 4));
  Eigen::Matrix<int,_3,_1,_0,_3,_1>::Matrix(&local_60,&min_y,&min_z,(Scalar *)&it);
  RGProblem::getInnerObstacles((RGProblem *)this,&local_54,&local_60,_min_x);
  return 0;
}

Assistant:

int get_important_obstacles(const RGProblem &problem, const RGRegion &region, std::vector<Eigen::Vector3i> *obstacles)
{
  int max_x = -10000;
  int min_x = 10000; 
  int max_y = -10000;
  int min_y = 10000; 
  int max_z = -10000;
  int min_z = 10000;
  for (auto it = region.region_bound_pts.cbegin(); it != region.region_bound_pts.cend(); ++it)
  {
    if (it->point.x() > max_x)
      max_x = it->point.x();
    if (it->point.x() < min_x)
      min_x = it->point.x();
    if (it->point.y() > max_y)
      max_y = it->point.y();
    if (it->point.y() < min_y)
      min_y = it->point.y();
    if (it->point.z() > max_z)
      max_z = it->point.z();
    if (it->point.z() < min_z)
      min_z = it->point.z();
  }

  problem.getInnerObstacles(Eigen::Vector3i(max_x, max_y, max_z), Eigen::Vector3i(min_x, min_y, min_z), obstacles);

  return OK;
}